

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void ft_var_done_item_variation_store(TT_Face face,GX_ItemVarStore itemStore)

{
  FT_Memory memory;
  GX_ItemVarData pGVar1;
  GX_VarRegion P;
  ulong uVar2;
  long lVar3;
  
  memory = (face->root).memory;
  pGVar1 = itemStore->varData;
  if (pGVar1 != (GX_ItemVarData)0x0) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < itemStore->dataCount; uVar2 = uVar2 + 1) {
      ft_mem_free(memory,*(void **)((long)&pGVar1->regionIndices + lVar3));
      pGVar1 = itemStore->varData;
      *(undefined8 *)((long)&pGVar1->regionIndices + lVar3) = 0;
      ft_mem_free(memory,*(void **)((long)&pGVar1->deltaSet + lVar3));
      pGVar1 = itemStore->varData;
      *(undefined8 *)((long)&pGVar1->deltaSet + lVar3) = 0;
      lVar3 = lVar3 + 0x18;
    }
    ft_mem_free(memory,pGVar1);
    itemStore->varData = (GX_ItemVarData)0x0;
  }
  P = itemStore->varRegionList;
  if (P != (GX_VarRegion)0x0) {
    for (uVar2 = 0; uVar2 < itemStore->regionCount; uVar2 = uVar2 + 1) {
      ft_mem_free(memory,P[uVar2].axisList);
      P = itemStore->varRegionList;
      P[uVar2].axisList = (GX_AxisCoords)0x0;
    }
    ft_mem_free(memory,P);
    itemStore->varRegionList = (GX_VarRegion)0x0;
  }
  return;
}

Assistant:

static void
  ft_var_done_item_variation_store( TT_Face          face,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Memory  memory = FT_FACE_MEMORY( face );
    FT_UInt    i;


    if ( itemStore->varData )
    {
      for ( i = 0; i < itemStore->dataCount; i++ )
      {
        FT_FREE( itemStore->varData[i].regionIndices );
        FT_FREE( itemStore->varData[i].deltaSet );
      }

      FT_FREE( itemStore->varData );
    }

    if ( itemStore->varRegionList )
    {
      for ( i = 0; i < itemStore->regionCount; i++ )
        FT_FREE( itemStore->varRegionList[i].axisList );

      FT_FREE( itemStore->varRegionList );
    }
  }